

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_req.cc
# Opt level: O1

int X509_REQ_add0_attr(X509_REQ *req,X509_ATTRIBUTE *attr)

{
  uint uVar1;
  OPENSSL_STACK *pOVar2;
  size_t sVar3;
  
  if (req->req_info->attributes == (stack_st_X509_ATTRIBUTE *)0x0) {
    pOVar2 = OPENSSL_sk_new_null();
    req->req_info->attributes = (stack_st_X509_ATTRIBUTE *)pOVar2;
  }
  pOVar2 = (OPENSSL_STACK *)req->req_info->attributes;
  if (pOVar2 == (OPENSSL_STACK *)0x0) {
    uVar1 = 0;
  }
  else {
    sVar3 = OPENSSL_sk_push(pOVar2,attr);
    uVar1 = (uint)(sVar3 != 0);
  }
  return uVar1;
}

Assistant:

static int X509_REQ_add0_attr(X509_REQ *req, X509_ATTRIBUTE *attr) {
  if (req->req_info->attributes == NULL) {
    req->req_info->attributes = sk_X509_ATTRIBUTE_new_null();
  }
  if (req->req_info->attributes == NULL ||
      !sk_X509_ATTRIBUTE_push(req->req_info->attributes, attr)) {
    return 0;
  }

  return 1;
}